

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O0

void __thiscall
Random_keys::cruzamento3
          (Random_keys *this,RK_Individual *pai1,RK_Individual *pai2,RK_Individual *filho)

{
  double dVar1;
  result_type __s;
  size_type sVar2;
  double *pdVar3;
  reference ppCVar4;
  ulong local_50;
  unsigned_long i_1;
  unsigned_long i;
  __normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
  local_38;
  __normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
  local_30;
  RK_Individual *local_28;
  RK_Individual *filho_local;
  RK_Individual *pai2_local;
  RK_Individual *pai1_local;
  Random_keys *this_local;
  
  local_28 = filho;
  filho_local = pai2;
  pai2_local = pai1;
  pai1_local = (RK_Individual *)this;
  local_30._M_current =
       (Chromosome **)
       std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::begin(&RK_Individual::cromossomos);
  local_38._M_current =
       (Chromosome **)
       std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::end(&RK_Individual::cromossomos);
  __s = time((time_t *)0x0);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&i,__s);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            (local_30,local_38,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&i);
  i_1 = 0;
  while( true ) {
    sVar2 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::size
                      (&RK_Individual::cromossomos);
    if (sVar2 >> 1 <= i_1) break;
    pdVar3 = RK_Individual::getWeights(pai2_local);
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,i_1);
    dVar1 = pdVar3[(*ppCVar4)->position];
    pdVar3 = RK_Individual::getWeights(local_28);
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,i_1);
    pdVar3[(*ppCVar4)->position] = dVar1;
    i_1 = i_1 + 1;
  }
  sVar2 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::size
                    (&RK_Individual::cromossomos);
  local_50 = sVar2 >> 1;
  while( true ) {
    sVar2 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::size
                      (&RK_Individual::cromossomos);
    if (sVar2 <= local_50) break;
    pdVar3 = RK_Individual::getWeights(filho_local);
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,local_50);
    dVar1 = pdVar3[(*ppCVar4)->position];
    pdVar3 = RK_Individual::getWeights(local_28);
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,local_50);
    pdVar3[(*ppCVar4)->position] = dVar1;
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

void Random_keys::cruzamento3(RK_Individual *pai1, RK_Individual *pai2, RK_Individual *filho) {
    shuffle(RK_Individual::cromossomos.begin(), RK_Individual::cromossomos.end(), std::default_random_engine(time(NULL)));

    for(unsigned long int i=0; i<RK_Individual::cromossomos.size()/2; i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = pai1->getWeights()[RK_Individual::cromossomos.at(i)->position];

    for(unsigned long int i=RK_Individual::cromossomos.size()/2; i<RK_Individual::cromossomos.size(); i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = pai2->getWeights()[RK_Individual::cromossomos.at(i)->position];

}